

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_impl.c
# Opt level: O0

void gf_25519_mulw_unsigned(gf_25519_s *cs,gf_25519_s *as,uint32_t b)

{
  undefined1 x [16];
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t *in_RDX;
  uint64_t in_RSI;
  ulong *in_RDI;
  uint64_t a1;
  uint64_t c1;
  uint64_t c0;
  __uint128_t accum;
  uint64_t *c;
  uint64_t mask;
  uint64_t *a;
  undefined1 in_stack_ffffffffffffff08 [12];
  undefined4 uVar4;
  __uint128_t *local_48;
  undefined8 local_40;
  ulong *local_30;
  undefined8 local_28;
  uint64_t local_20;
  uint local_14;
  
  local_14 = (uint)in_RDX;
  local_28 = 0x7ffffffffffff;
  local_30 = in_RDI;
  local_20 = in_RSI;
  local_48 = widemul_rm((__uint128_t *)((ulong)in_RDX & 0xffffffff),in_RSI,in_RDX);
  uVar1 = (ulong)local_48 & 0x7ffffffffffff;
  uVar4 = 0x33;
  x._12_4_ = 0x33;
  x._0_12_ = in_stack_ffffffffffffff08;
  local_48 = (__uint128_t *)shrld((__uint128_t)x,(int)local_48);
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,(ulong)local_14,(uint64_t *)(local_20 + 8));
  uVar2 = (ulong)local_48 & 0x7ffffffffffff;
  x_00._12_4_ = uVar4;
  x_00._0_12_ = in_stack_ffffffffffffff08;
  local_48 = (__uint128_t *)shrld((__uint128_t)x_00,(int)local_48);
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,(ulong)local_14,(uint64_t *)(local_20 + 0x10));
  local_30[2] = (ulong)local_48 & 0x7ffffffffffff;
  x_01._12_4_ = uVar4;
  x_01._0_12_ = in_stack_ffffffffffffff08;
  local_48 = (__uint128_t *)shrld((__uint128_t)x_01,(int)local_48);
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,(ulong)local_14,(uint64_t *)(local_20 + 0x18));
  local_30[3] = (ulong)local_48 & 0x7ffffffffffff;
  x_02._12_4_ = uVar4;
  x_02._0_12_ = in_stack_ffffffffffffff08;
  local_48 = (__uint128_t *)shrld((__uint128_t)x_02,(int)local_48);
  local_40 = 0;
  mac_rm((__uint128_t *)&local_48,(ulong)local_14,(uint64_t *)(local_20 + 0x20));
  local_30[4] = (ulong)local_48 & 0x7ffffffffffff;
  x_03._12_4_ = uVar4;
  x_03._0_12_ = in_stack_ffffffffffffff08;
  uVar3 = shrld((__uint128_t)x_03,(int)local_48);
  uVar1 = uVar3 * 0x13 + uVar1;
  *local_30 = uVar1 & 0x7ffffffffffff;
  local_30[1] = uVar2 + (uVar1 >> 0x33);
  return;
}

Assistant:

void gf_mulw_unsigned (gf_s *__restrict__ cs, const gf as, uint32_t b) {
    const uint64_t *a = as->limb, mask = ((1ull<<51)-1);
    uint64_t *c = cs->limb;

    __uint128_t accum = widemul_rm(b, &a[0]);
    uint64_t c0 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[1]);
    uint64_t c1 = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[2]);
    c[2] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[3]);
    c[3] = accum & mask;
    accum = shrld(accum,51);
    
    mac_rm(&accum, b, &a[4]);
    c[4] = accum & mask;

    uint64_t a1 = shrld(accum,51);
    a1 = a1*19+c0;
    
    c[0] = a1 & mask;
    c[1] = c1 + (a1>>51);
}